

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

int __thiscall
picojson::_parse_quadhex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (picojson *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar3 = 0;
  iVar4 = 4;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      return iVar3;
    }
    iVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc((input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,(FILE *)in);
    if (iVar1 == -1) break;
    uVar2 = iVar1 - 0x30;
    if (9 < uVar2) {
      if (iVar1 - 0x41U < 6) {
        uVar2 = iVar1 - 0x37;
      }
      else {
        if (5 < iVar1 - 0x61U) {
          this[0x10] = (picojson)0x0;
          return -1;
        }
        uVar2 = iVar1 - 0x57;
      }
    }
    iVar3 = iVar3 * 0x10 + uVar2;
  }
  return -1;
}

Assistant:

inline int _parse_quadhex(input<Iter> &in) {
  int uni_ch = 0, hex;
  for (int i = 0; i < 4; i++) {
    if ((hex = in.getc()) == -1) {
      return -1;
    }
    if ('0' <= hex && hex <= '9') {
      hex -= '0';
    } else if ('A' <= hex && hex <= 'F') {
      hex -= 'A' - 0xa;
    } else if ('a' <= hex && hex <= 'f') {
      hex -= 'a' - 0xa;
    } else {
      in.ungetc();
      return -1;
    }
    uni_ch = uni_ch * 16 + hex;
  }
  return uni_ch;
}